

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zello_log.h
# Opt level: O1

string * to_string_abi_cxx11_(ze_native_kernel_uuid_t uuid)

{
  ostream *poVar1;
  int i;
  long lVar2;
  string *in_RDI;
  ostringstream result;
  char local_1b9;
  char local_1b8 [16];
  long local_1a8 [3];
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{",1);
  lVar2 = 0;
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"0x",2);
    *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
    local_1b9 = local_1b8[lVar2];
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1b9,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\b}",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return in_RDI;
}

Assistant:

std::string to_string(const ze_native_kernel_uuid_t uuid) {
  std::ostringstream result;
  result << "{";
  for (int i = 0; i < ZE_MAX_NATIVE_KERNEL_UUID_SIZE; i++) {
    result << "0x" << std::hex << uuid.id[i] << ",";
  }
  result << "\b}";
  return result.str();
}